

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout_p.h
# Opt level: O0

QList<int> * __thiscall
QMainWindowLayoutSeparatorHelper<QMainWindowLayout>::findSeparator
          (QMainWindowLayoutSeparatorHelper<QMainWindowLayout> *this,QPoint *pos)

{
  long lVar1;
  bool bVar2;
  QMainWindowLayout *this_00;
  QDockAreaLayout *this_01;
  QWidget *pQVar3;
  QToolBar *pQVar4;
  QMainWindowLayoutSeparatorHelper<QMainWindowLayout> *in_RSI;
  QToolBarAreaLayout *in_RDI;
  long in_FS_OFFSET;
  QToolBar *toolBar;
  QWidget *childWidget;
  QWidget *widget;
  QToolBarAreaLayout *toolBarAreaLayout;
  QMainWindowLayout *layout;
  QToolBarAreaLayout *this_02;
  QPoint *in_stack_ffffffffffffffa0;
  QWidget *in_stack_ffffffffffffffa8;
  QWidget *in_stack_ffffffffffffffb0;
  QWidget *in_stack_ffffffffffffffe0;
  QToolBarAreaLayout *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = in_RDI;
  this_00 = QMainWindowLayoutSeparatorHelper<QMainWindowLayout>::layout(in_RSI);
  this_01 = (QDockAreaLayout *)QMainWindowLayout::toolBarAreaLayout((QMainWindowLayout *)this_00);
  if ((this_01 != (QDockAreaLayout *)0x0) && (bVar2 = QToolBarAreaLayout::isEmpty(this_02), !bVar2))
  {
    in_stack_ffffffffffffffb0 =
         window((QMainWindowLayoutSeparatorHelper<QMainWindowLayout> *)0x5ef54c);
    pQVar3 = QWidget::childAt(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    while (pQVar3 != (QWidget *)0x0 && pQVar3 != in_stack_ffffffffffffffb0) {
      pQVar4 = qobject_cast<QToolBar*>((QObject *)0x5ef59b);
      if (pQVar4 != (QToolBar *)0x0) {
        QToolBarAreaLayout::indexOf(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
        bVar2 = QList<int>::isEmpty((QList<int> *)0x5ef5c6);
        QList<int>::~QList((QList<int> *)0x5ef5d6);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          memset(in_RDI,0,0x18);
          QList<int>::QList((QList<int> *)0x5ef5fb);
          goto LAB_005ef631;
        }
      }
      pQVar3 = QWidget::parentWidget((QWidget *)0x5ef609);
    }
  }
  QMainWindowLayout::dockAreaLayoutInfo((QMainWindowLayout *)this_00);
  QDockAreaLayout::findSeparator(this_01,(QPoint *)in_stack_ffffffffffffffb0);
LAB_005ef631:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QList<int> *)this_02;
  }
  __stack_chk_fail();
}

Assistant:

QList<int> QMainWindowLayoutSeparatorHelper<Layout>::findSeparator(const QPoint &pos) const
{
    Layout *layout = const_cast<Layout*>(this->layout());
#if QT_CONFIG(toolbar)
    QToolBarAreaLayout *toolBarAreaLayout = layout->toolBarAreaLayout();
    if (toolBarAreaLayout && !toolBarAreaLayout->isEmpty()) {
        // We might have a toolbar that is currently expanded, covering
        // parts of the dock area, in which case we don't want the dock
        // area layout to treat mouse events for the expanded toolbar as
        // hitting a separator.
        const QWidget *widget = layout->window();
        QWidget *childWidget = widget->childAt(pos);
        while (childWidget && childWidget != widget) {
            if (auto *toolBar = qobject_cast<QToolBar*>(childWidget)) {
                if (!toolBarAreaLayout->indexOf(toolBar).isEmpty())
                    return {};
            }
            childWidget = childWidget->parentWidget();
        }
    }
#endif
    return layout->dockAreaLayoutInfo()->findSeparator(pos);
}